

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autotune.cc
# Opt level: O0

void __thiscall fasttext::Autotune::train(Autotune *this,Args *autotuneArgs)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  invalid_argument *this_00;
  Autotune *this_01;
  runtime_error *this_02;
  ostream *poVar4;
  void *pvVar5;
  long in_RSI;
  long in_RDI;
  double dVar6;
  string errorMessage;
  EncounteredNaNError *anon_var_0;
  bad_alloc *anon_var_0_1;
  TimeoutError *anon_var_0_2;
  AbortError *anon_var_0_3;
  Meter meter;
  bool sizeConstraintOK;
  double currentScore;
  ElapsedTimeMarker elapsedTimeMarker;
  Args trainArgs;
  Args bestTrainArgs;
  int verbose;
  bool sizeConstraintWarning;
  ifstream validationFileStream;
  pointer in_stack_fffffffffffff738;
  AutotuneStrategy *in_stack_fffffffffffff740;
  double in_stack_fffffffffffff748;
  Autotune *in_stack_fffffffffffff750;
  Args *in_stack_fffffffffffff780;
  Args *in_stack_fffffffffffff788;
  undefined4 in_stack_fffffffffffff790;
  int in_stack_fffffffffffff794;
  Autotune *in_stack_fffffffffffff798;
  Args *in_stack_fffffffffffff7a8;
  string *in_stack_fffffffffffff7b8;
  ostream *in_stack_fffffffffffff7c0;
  Meter *meter_00;
  string local_808 [32];
  Meter *in_stack_fffffffffffff818;
  real in_stack_fffffffffffff820;
  int32_t in_stack_fffffffffffff824;
  istream *in_stack_fffffffffffff828;
  FastText *in_stack_fffffffffffff830;
  string local_7c8 [36];
  metric_name local_7a4;
  undefined1 local_729;
  Args *local_728;
  Args *in_stack_fffffffffffff928;
  Autotune *in_stack_fffffffffffff930;
  double in_stack_fffffffffffff980;
  AutotuneStrategy *in_stack_fffffffffffff988;
  Args *in_stack_fffffffffffff9e8;
  Autotune *in_stack_fffffffffffff9f0;
  Args *in_stack_fffffffffffffa28;
  FastText *in_stack_fffffffffffffa30;
  Meter local_578 [2];
  undefined4 local_490;
  undefined4 local_2f0;
  undefined4 local_22c;
  byte local_225;
  undefined1 local_218 [520];
  long local_10;
  
  local_10 = in_RSI;
  std::ifstream::ifstream(local_218,(string *)(in_RSI + 0x138),_S_in);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Validation file cannot be opened!");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  printSkippedArgs(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  local_225 = 0;
  local_22c = *(undefined4 *)(local_10 + 0xe0);
  Args::Args((Args *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
             in_stack_fffffffffffff788);
  Args::Args((Args *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
             in_stack_fffffffffffff788);
  local_490 = 0;
  this_01 = (Autotune *)operator_new(0x1e0);
  AutotuneStrategy::AutotuneStrategy
            ((AutotuneStrategy *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
             in_stack_fffffffffffff788,(result_type)in_stack_fffffffffffff780);
  meter_00 = local_578;
  std::unique_ptr<fasttext::AutotuneStrategy,std::default_delete<fasttext::AutotuneStrategy>>::
  unique_ptr<std::default_delete<fasttext::AutotuneStrategy>,void>
            ((unique_ptr<fasttext::AutotuneStrategy,_std::default_delete<fasttext::AutotuneStrategy>_>
              *)in_stack_fffffffffffff740,in_stack_fffffffffffff738);
  std::unique_ptr<fasttext::AutotuneStrategy,_std::default_delete<fasttext::AutotuneStrategy>_>::
  operator=((unique_ptr<fasttext::AutotuneStrategy,_std::default_delete<fasttext::AutotuneStrategy>_>
             *)in_stack_fffffffffffff740,
            (unique_ptr<fasttext::AutotuneStrategy,_std::default_delete<fasttext::AutotuneStrategy>_>
             *)in_stack_fffffffffffff738);
  std::unique_ptr<fasttext::AutotuneStrategy,_std::default_delete<fasttext::AutotuneStrategy>_>::
  ~unique_ptr((unique_ptr<fasttext::AutotuneStrategy,_std::default_delete<fasttext::AutotuneStrategy>_>
               *)in_stack_fffffffffffff750);
  startTimer(in_stack_fffffffffffff930,in_stack_fffffffffffff928);
  while (bVar2 = keepTraining(in_stack_fffffffffffff750,in_stack_fffffffffffff748), bVar2) {
    *(int *)(in_RDI + 0x20) = *(int *)(in_RDI + 0x20) + 1;
    std::unique_ptr<fasttext::AutotuneStrategy,_std::default_delete<fasttext::AutotuneStrategy>_>::
    operator->((unique_ptr<fasttext::AutotuneStrategy,_std::default_delete<fasttext::AutotuneStrategy>_>
                *)0x1792fe);
    AutotuneStrategy::ask(in_stack_fffffffffffff988,in_stack_fffffffffffff980);
    Args::operator=(&in_stack_fffffffffffff740->bestArgs_,&in_stack_fffffffffffff738->bestArgs_);
    Args::~Args(&in_stack_fffffffffffff740->bestArgs_);
    if (2 < *(int *)(local_10 + 0xe0)) {
      in_stack_fffffffffffff7c0 = std::operator<<((ostream *)&std::cout,"Trial = ");
      in_stack_fffffffffffff7b8 =
           (string *)std::ostream::operator<<(in_stack_fffffffffffff7c0,*(int *)(in_RDI + 0x20));
      std::ostream::operator<<(in_stack_fffffffffffff7b8,std::endl<char,std::char_traits<char>>);
    }
    printArgs((Autotune *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
              in_stack_fffffffffffff788,in_stack_fffffffffffff780);
    anon_unknown.dwarf_2ad97::ElapsedTimeMarker::ElapsedTimeMarker
              ((ElapsedTimeMarker *)in_stack_fffffffffffff740);
    local_728 = (Args *)std::numeric_limits<double>::quiet_NaN();
    std::__shared_ptr_access<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x17944c);
    FastText::train(in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
    local_729 = quantize(in_stack_fffffffffffff798,
                         (Args *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
                         in_stack_fffffffffffff788);
    if ((bool)local_729) {
      Meter::Meter((Meter *)in_stack_fffffffffffff740);
      std::__shared_ptr_access<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1794b8);
      FastText::test(in_stack_fffffffffffff830,in_stack_fffffffffffff828,in_stack_fffffffffffff824,
                     in_stack_fffffffffffff820,in_stack_fffffffffffff818);
      local_7a4 = Args::getAutotuneMetric(in_stack_fffffffffffff7a8);
      Args::getAutotuneMetricLabel_abi_cxx11_(in_stack_fffffffffffff788);
      in_stack_fffffffffffff7a8 =
           (Args *)getMetricScore(this_01,meter_00,(metric_name *)in_stack_fffffffffffff7c0,
                                  in_stack_fffffffffffff7b8);
      local_728 = in_stack_fffffffffffff7a8;
      std::__cxx11::string::~string(local_7c8);
      if (((*(double *)(in_RDI + 0x18) == -1.0) && (!NAN(*(double *)(in_RDI + 0x18)))) ||
         (*(double *)(in_RDI + 0x18) < (double)local_728)) {
        Args::operator=(&in_stack_fffffffffffff740->bestArgs_,&in_stack_fffffffffffff738->bestArgs_)
        ;
        *(Args **)(in_RDI + 0x18) = local_728;
        std::
        unique_ptr<fasttext::AutotuneStrategy,_std::default_delete<fasttext::AutotuneStrategy>_>::
        operator->((unique_ptr<fasttext::AutotuneStrategy,_std::default_delete<fasttext::AutotuneStrategy>_>
                    *)0x1795d3);
        AutotuneStrategy::updateBest
                  (in_stack_fffffffffffff740,&in_stack_fffffffffffff738->bestArgs_);
      }
      Meter::~Meter((Meter *)in_stack_fffffffffffff740);
    }
    else {
      *(int *)(in_RDI + 0x24) = *(int *)(in_RDI + 0x24) + 1;
      if ((((local_225 & 1) == 0) && (10 < *(int *)(in_RDI + 0x20))) &&
         (in_stack_fffffffffffff794 = *(int *)(in_RDI + 0x24),
         *(int *)(in_RDI + 0x20) / 2 < in_stack_fffffffffffff794)) {
        local_225 = 1;
        in_stack_fffffffffffff788 =
             (Args *)std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
        in_stack_fffffffffffff780 =
             (Args *)std::operator<<((ostream *)in_stack_fffffffffffff788,
                                     "Warning : requested model size is probably too small. You may want to increase `autotune-modelsize`."
                                    );
        std::ostream::operator<<(in_stack_fffffffffffff780,std::endl<char,std::char_traits<char>>);
      }
    }
    if (2 < *(int *)(local_10 + 0xe0)) {
      uVar3 = std::isnan((double)local_728);
      if ((uVar3 & 1) == 0) {
        poVar4 = std::operator<<((ostream *)&std::cout,"currentScore = ");
        pvVar5 = (void *)std::ostream::operator<<(poVar4,(double)local_728);
        std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
      }
      else {
        in_stack_fffffffffffff798 =
             (Autotune *)std::operator<<((ostream *)&std::cout,"currentScore = NaN");
        std::ostream::operator<<(in_stack_fffffffffffff798,std::endl<char,std::char_traits<char>>);
      }
    }
    if (2 < *(int *)(local_10 + 0xe0)) {
      poVar4 = std::operator<<((ostream *)&std::cout,"train took = ");
      dVar6 = anon_unknown.dwarf_2ad97::ElapsedTimeMarker::getElapsed
                        ((ElapsedTimeMarker *)in_stack_fffffffffffff740);
      pvVar5 = (void *)std::ostream::operator<<(poVar4,dVar6);
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    }
  }
  bVar2 = std::thread::joinable((thread *)in_stack_fffffffffffff740);
  if (bVar2) {
    std::thread::join();
  }
  if ((*(double *)(in_RDI + 0x18) == -1.0) && (!NAN(*(double *)(in_RDI + 0x18)))) {
    std::__cxx11::string::string(local_808);
    if ((local_225 & 1) == 0) {
      std::__cxx11::string::operator=
                (local_808,
                 "Didn\'t have enough time to train once: please increase `autotune-duration`.");
    }
    else {
      std::__cxx11::string::operator=
                (local_808,
                 "Couldn\'t fulfil model size constraint: please increase `autotune-modelsize`.");
    }
    this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_02,local_808);
    __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cerr,"Training again with best arguments");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  local_2f0 = local_22c;
  if (2 < *(int *)(local_10 + 0xe0)) {
    in_stack_fffffffffffff740 =
         (AutotuneStrategy *)std::operator<<((ostream *)&std::cout,"Best selected args = ");
    pvVar5 = (void *)std::ostream::operator<<(in_stack_fffffffffffff740,0);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  }
  printArgs((Autotune *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
            in_stack_fffffffffffff788,in_stack_fffffffffffff780);
  std::__shared_ptr_access<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x179ad6);
  FastText::train(in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
  quantize(in_stack_fffffffffffff798,
           (Args *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
           in_stack_fffffffffffff788);
  Args::~Args(&in_stack_fffffffffffff740->bestArgs_);
  Args::~Args(&in_stack_fffffffffffff740->bestArgs_);
  std::ifstream::~ifstream(local_218);
  return;
}

Assistant:

void Autotune::train(const Args& autotuneArgs) {
  std::ifstream validationFileStream(autotuneArgs.autotuneValidationFile);
  if (!validationFileStream.is_open()) {
    throw std::invalid_argument("Validation file cannot be opened!");
  }
  printSkippedArgs(autotuneArgs);

  bool sizeConstraintWarning = false;
  int verbose = autotuneArgs.verbose;
  Args bestTrainArgs(autotuneArgs);
  Args trainArgs(autotuneArgs);
  trainArgs.verbose = 0;
  strategy_ = std::unique_ptr<AutotuneStrategy>(
      new AutotuneStrategy(trainArgs, autotuneArgs.seed));
  startTimer(autotuneArgs);

  while (keepTraining(autotuneArgs.autotuneDuration)) {
    trials_++;

    trainArgs = strategy_->ask(elapsed_);
    LOG_VAL(Trial, trials_)
    printArgs(trainArgs, autotuneArgs);
    ElapsedTimeMarker elapsedTimeMarker;
    double currentScore = std::numeric_limits<double>::quiet_NaN();
    try {
      fastText_->train(trainArgs);
      bool sizeConstraintOK = quantize(trainArgs, autotuneArgs);
      if (sizeConstraintOK) {
        Meter meter;
        fastText_->test(
            validationFileStream, autotuneArgs.autotunePredictions, 0.0, meter);

        currentScore = getMetricScore(
            meter,
            autotuneArgs.getAutotuneMetric(),
            autotuneArgs.getAutotuneMetricLabel());

        if (bestScore_ == kUnknownBestScore ||
            (currentScore > bestScore_)) {
          bestTrainArgs = trainArgs;
          bestScore_ = currentScore;
          strategy_->updateBest(bestTrainArgs);
        }
      } else {
        sizeConstraintFailed_++;
        if (!sizeConstraintWarning && trials_ > 10 &&
            sizeConstraintFailed_ > (trials_ / 2)) {
          sizeConstraintWarning = true;
          std::cerr
              << std::endl
              << "Warning : requested model size is probably too small. You may want to increase `autotune-modelsize`."
              << std::endl;
        }
      }
    } catch (DenseMatrix::EncounteredNaNError&) {
      // ignore diverging loss and go on
    } catch (std::bad_alloc&) {
      // ignore parameter samples asking too much memory
    } catch (TimeoutError&) {
      break;
    } catch (FastText::AbortError&) {
      break;
    }
    LOG_VAL_NAN(currentScore, currentScore)
    LOG_VAL(train took, elapsedTimeMarker.getElapsed())
  }
  if (timer_.joinable()) {
    timer_.join();
  }

  if (bestScore_ == kUnknownBestScore) {
    std::string errorMessage;
    if (sizeConstraintWarning) {
      errorMessage =
          "Couldn't fulfil model size constraint: please increase `autotune-modelsize`.";
    } else {
      errorMessage =
          "Didn't have enough time to train once: please increase `autotune-duration`.";
    }
    throw std::runtime_error(errorMessage);
  } else {
    std::cerr << std::endl;
    std::cerr << "Training again with best arguments" << std::endl;
    bestTrainArgs.verbose = verbose;
    LOG_VAL(Best selected args, 0)
    printArgs(bestTrainArgs, autotuneArgs);
    fastText_->train(bestTrainArgs);
    quantize(bestTrainArgs, autotuneArgs);
  }
}